

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O1

from_chars_result __thiscall
semver::detail::version_parser::parse_prerelease_tag
          (version_parser *this,string *out,
          vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
          *out_identifiers)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  token_stream *ptVar2;
  char *pcVar3;
  errc eVar4;
  string *__range2;
  long lVar5;
  bool bVar6;
  from_chars_result fVar7;
  string identifier;
  string result;
  string local_a8;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  string *local_68;
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  *local_60;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_88 = &local_78;
  local_80 = 0;
  local_78 = 0;
  paVar1 = &local_a8.field_2;
  local_68 = out;
  local_60 = out_identifiers;
  do {
    if (local_80 != 0) {
      std::__cxx11::string::push_back((char)&local_88);
    }
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    fVar7 = parse_prerelease_identifier(this,&local_a8);
    pcVar3 = fVar7.super_from_chars_result.ptr;
    eVar4 = fVar7.super_from_chars_result.ec;
    if (eVar4 != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0010365d;
    }
    std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
    if (local_a8._M_string_length == 0) {
      local_58._0_4_ = numeric;
    }
    else {
      local_58._0_4_ = numeric;
      lVar5 = 0;
      do {
        if (0xe5 < (byte)((local_a8._M_dataplus._M_p[lVar5] & 0xdfU) + 0xa5) ||
            local_a8._M_dataplus._M_p[lVar5] == 0x2d) {
          local_58._0_4_ = alphanumeric;
          break;
        }
        bVar6 = local_a8._M_string_length - 1 != lVar5;
        lVar5 = lVar5 + 1;
      } while (bVar6);
    }
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    std::
    vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
    ::emplace_back<semver::detail::prerelease_identifier>
              (local_60,(prerelease_identifier *)local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
    ptVar2 = this->stream;
    if ((ptVar2->tokens).
        super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
        super__Vector_impl_data._M_start[ptVar2->current].type != dot) {
      std::__cxx11::string::_M_assign((string *)local_68);
      pcVar3 = (this->stream->tokens).
               super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
               _M_impl.super__Vector_impl_data._M_start[this->stream->current].lexeme;
      eVar4 = 0;
LAB_0010365d:
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
      }
      fVar7.super_from_chars_result.ec = eVar4;
      fVar7.super_from_chars_result.ptr = pcVar3;
      fVar7.super_from_chars_result._12_4_ = 0;
      return (from_chars_result)fVar7.super_from_chars_result;
    }
    ptVar2->current = ptVar2->current + 1;
  } while( true );
}

Assistant:

parse_prerelease_tag(std::string& out, std::vector<detail::prerelease_identifier>& out_identifiers) {
    std::string result;

    do {
      if (!result.empty()) {
        result.push_back('.');
      }

      std::string identifier;
      if (const auto res = parse_prerelease_identifier(identifier); !res) {
        return res;
      }

      result.append(identifier);
      out_identifiers.push_back(make_prerelease_identifier(identifier));

    } while (stream.advanceIfMatch(token_type::dot));

    out = result;
    return success(stream.peek().lexeme);
  }